

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O1

void enlarge_ntuple_list(ntuple_list n_tuple)

{
  int *piVar1;
  double *pdVar2;
  undefined8 *puVar3;
  void *pvVar4;
  image_char piVar5;
  image_int piVar6;
  uint uVar7;
  uint extraout_EDX;
  int extraout_EDX_00;
  uint in_ESI;
  size_t __size;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint xsize;
  ntuple_list pnVar11;
  ntuple_list pnVar12;
  uint uVar13;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  
  pnVar12 = n_tuple;
  if ((n_tuple == (ntuple_list)0x0) ||
     (pnVar12 = (ntuple_list)n_tuple->values, pnVar12 == (ntuple_list)0x0)) {
LAB_001040ff:
    enlarge_ntuple_list();
  }
  else {
    in_ESI = n_tuple->max_size;
    if (in_ESI == 0) goto LAB_001040ff;
    n_tuple->max_size = in_ESI * 2;
    __size = (ulong)(in_ESI * 2 * n_tuple->dim) << 3;
    pdVar2 = (double *)realloc(pnVar12,__size);
    in_ESI = (uint)__size;
    n_tuple->values = pdVar2;
    if (pdVar2 != (double *)0x0) {
      return;
    }
  }
  enlarge_ntuple_list();
  if (pnVar12 == (ntuple_list)0x0) {
    add_5tuple();
    pnVar11 = pnVar12;
LAB_001041b4:
    add_5tuple();
  }
  else {
    pnVar11 = pnVar12;
    if (pnVar12->dim != 5) goto LAB_001041b4;
    if (pnVar12->size == pnVar12->max_size) {
      enlarge_ntuple_list(pnVar12);
    }
    pdVar2 = pnVar12->values;
    if (pdVar2 != (double *)0x0) {
      uVar13 = pnVar12->size;
      uVar7 = pnVar12->dim * uVar13;
      pdVar2[uVar7] = extraout_XMM0_Qa;
      pdVar2[uVar7 + 1] = in_XMM1_Qa;
      pdVar2[uVar7 + 2] = in_XMM2_Qa;
      pdVar2[uVar7 + 3] = in_XMM3_Qa;
      pdVar2[uVar7 + 4] = in_XMM4_Qa;
      pnVar12->size = uVar13 + 1;
      return;
    }
  }
  add_5tuple();
  pnVar12 = pnVar11;
  if ((pnVar11 != (ntuple_list)0x0) &&
     (pnVar12 = *(ntuple_list *)pnVar11, pnVar12 != (ntuple_list)0x0)) {
    free(pnVar12);
    free(pnVar11);
    return;
  }
  free_image_char();
  iVar9 = (int)pnVar12;
  uVar13 = in_ESI;
  if (iVar9 == 0) {
LAB_0010422b:
    new_image_char();
LAB_00104230:
    new_image_char();
  }
  else {
    if (in_ESI == 0) goto LAB_0010422b;
    pnVar12 = (ntuple_list)0x10;
    puVar3 = (undefined8 *)malloc(0x10);
    if (puVar3 == (undefined8 *)0x0) goto LAB_00104230;
    pnVar12 = (ntuple_list)(ulong)(in_ESI * iVar9);
    uVar13 = 1;
    pvVar4 = calloc((size_t)pnVar12,1);
    *puVar3 = pvVar4;
    if (pvVar4 != (void *)0x0) {
      *(int *)(puVar3 + 1) = iVar9;
      *(uint *)((long)puVar3 + 0xc) = in_ESI;
      return;
    }
  }
  new_image_char();
  uVar10 = (uint)pnVar12;
  uVar7 = uVar13;
  piVar5 = new_image_char(uVar10,uVar13);
  if ((piVar5 != (image_char)0x0) &&
     (pnVar12 = (ntuple_list)piVar5->data, pnVar12 != (ntuple_list)0x0)) {
    uVar13 = uVar13 * uVar10;
    if (uVar13 != 0) {
      memset(pnVar12,extraout_EDX & 0xff,(ulong)uVar13);
    }
    return;
  }
  new_image_char_ini();
  pnVar11 = pnVar12;
  if ((pnVar12 != (ntuple_list)0x0) &&
     (pnVar11 = *(ntuple_list *)pnVar12, pnVar11 != (ntuple_list)0x0)) {
    free(pnVar11);
    free(pnVar12);
    return;
  }
  uVar10 = (uint)pnVar11;
  free_image_int();
  uVar13 = uVar7;
  if ((uVar10 == 0) || (uVar7 == 0)) {
    xsize = uVar10;
    new_image_int();
  }
  else {
    xsize = 0x10;
    puVar3 = (undefined8 *)malloc(0x10);
    if (puVar3 != (undefined8 *)0x0) {
      xsize = uVar7 * uVar10;
      uVar13 = 4;
      pvVar4 = calloc((ulong)xsize,4);
      *puVar3 = pvVar4;
      if (pvVar4 != (void *)0x0) {
        *(uint *)(puVar3 + 1) = uVar10;
        *(uint *)((long)puVar3 + 0xc) = uVar7;
        return;
      }
      goto LAB_001042fd;
    }
  }
  new_image_int();
LAB_001042fd:
  new_image_int();
  piVar6 = new_image_int(xsize,uVar13);
  if (uVar13 * xsize != 0) {
    piVar1 = piVar6->data;
    uVar8 = 0;
    do {
      piVar1[uVar8] = extraout_EDX_00;
      uVar8 = uVar8 + 1;
    } while (uVar13 * xsize != uVar8);
  }
  return;
}

Assistant:

void enlarge_ntuple_list(ntuple_list n_tuple)
{
    /* check parameters */
    if ( n_tuple == NULL || n_tuple->values == NULL || n_tuple->max_size == 0 )
        error("enlarge_ntuple_list: invalid n-tuple.");

    /* duplicate number of tuples */
    n_tuple->max_size *= 2;

    /* realloc memory */
    n_tuple->values = (double *) realloc( (void *) n_tuple->values,
                                          n_tuple->dim * n_tuple->max_size * sizeof(double) );
    if ( n_tuple->values == NULL ) error("not enough memory.");
}